

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

double __thiscall sector_t::FindLowestCeilingSurrounding(sector_t *this,vertex_t **v)

{
  line_t_conflict *line;
  sector_t_conflict *psVar1;
  double dVar2;
  int local_4c;
  int i;
  line_t_conflict *check;
  vertex_t *spot;
  sector_t_conflict *other;
  double oceil;
  double height;
  vertex_t **v_local;
  sector_t_conflict *this_local;
  
  if (this->linecount == 0) {
    this_local = (sector_t_conflict *)GetPlaneTexZ(this,1);
  }
  else {
    check = (line_t_conflict *)(*this->lines)->v1;
    oceil = 3.4028234663852886e+38;
    for (local_4c = 0; local_4c < this->linecount; local_4c = local_4c + 1) {
      line = this->lines[local_4c];
      psVar1 = getNextSector(line,(sector_t_conflict *)this);
      if (psVar1 != (sector_t_conflict *)0x0) {
        dVar2 = secplane_t::ZatPoint(&psVar1->ceilingplane,line->v1);
        if (dVar2 < oceil) {
          check = (line_t_conflict *)line->v1;
          oceil = dVar2;
        }
        dVar2 = secplane_t::ZatPoint(&psVar1->ceilingplane,line->v2);
        if (dVar2 < oceil) {
          check = (line_t_conflict *)line->v2;
          oceil = dVar2;
        }
      }
    }
    if (v != (vertex_t **)0x0) {
      *v = (vertex_t *)check;
    }
    this_local = (sector_t_conflict *)oceil;
  }
  return (double)this_local;
}

Assistant:

double sector_t::FindLowestCeilingSurrounding (vertex_t **v) const
{
	double height;
	double oceil;
	sector_t *other;
	vertex_t *spot;
	line_t *check;
	int i;

	if (linecount == 0) return GetPlaneTexZ(sector_t::ceiling);

	spot = lines[0]->v1;
	height = FLT_MAX;

	for (i = 0; i < linecount; i++)
	{
		check = lines[i];
		if (NULL != (other = getNextSector (check, this)))
		{
			oceil = other->ceilingplane.ZatPoint(check->v1);
			if (oceil < height)
			{
				height = oceil;
				spot = check->v1;
			}
			oceil = other->ceilingplane.ZatPoint(check->v2);
			if (oceil < height)
			{
				height = oceil;
				spot = check->v2;
			}
		}
	}
	if (v != NULL)
		*v = spot;
	return height;
}